

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhistory.cc
# Opt level: O0

void __thiscall
bdHistory::addMsg(bdHistory *this,bdId *id,bdToken *param_2,uint32_t msgType,bool incoming,
                 bdNodeId *aboutId)

{
  MsgRegister local_d0;
  pair<long,_MsgRegister> local_90;
  bdMsgHistoryList *local_48;
  bdMsgHistoryList *histRef;
  iterator it;
  time_t now;
  bdNodeId *aboutId_local;
  bool incoming_local;
  uint32_t msgType_local;
  bdToken *param_2_local;
  bdId *id_local;
  bdHistory *this_local;
  
  it._M_node = (_Base_ptr)time((time_t *)0x0);
  std::_Rb_tree_iterator<std::pair<const_bdId,_bdMsgHistoryList>_>::_Rb_tree_iterator
            ((_Rb_tree_iterator<std::pair<const_bdId,_bdMsgHistoryList>_> *)&histRef);
  local_48 = std::
             map<bdId,_bdMsgHistoryList,_std::less<bdId>,_std::allocator<std::pair<const_bdId,_bdMsgHistoryList>_>_>
             ::operator[](&this->mHistory,id);
  memcpy(&local_48->mId,id,0x24);
  bdMsgHistoryList::addMsg(local_48,(time_t)it._M_node,msgType,incoming,aboutId);
  MsgRegister::MsgRegister(&local_d0,id,msgType,incoming,aboutId);
  std::make_pair<long&,MsgRegister>(&local_90,(long *)&it,&local_d0);
  std::multimap<long,MsgRegister,std::less<long>,std::allocator<std::pair<long_const,MsgRegister>>>
  ::insert<std::pair<long,MsgRegister>>
            ((multimap<long,MsgRegister,std::less<long>,std::allocator<std::pair<long_const,MsgRegister>>>
              *)&this->mMsgTimeline,&local_90);
  return;
}

Assistant:

void bdHistory::addMsg(const bdId *id, bdToken * /*transId*/, uint32_t msgType, bool incoming, const bdNodeId *aboutId) {
	//std::cerr << "bdHistory::addMsg() ";
	//bdStdPrintId(std::cerr, id);
	//std::cerr << std::endl;

	time_t now = time(NULL);

	std::map<bdId, bdMsgHistoryList>::iterator it;
	bdMsgHistoryList &histRef = mHistory[*id]; /* will instaniate empty */
	histRef.mId = *id;
	histRef.addMsg(now, msgType, incoming, aboutId);

	/* add to mMsgTimeline */
	mMsgTimeline.insert(std::make_pair(now, MsgRegister(id, msgType, incoming, aboutId)));
}